

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O0

optional<const_tinyusdz::PrimSpec_*> *
tinyusdz::anon_unknown_237::GetPrimSpecAtPathRec
          (optional<const_tinyusdz::PrimSpec_*> *__return_storage_ptr__,PrimSpec *parent,
          string *parent_path,Path *path,uint32_t depth)

{
  __type _Var1;
  bool bVar2;
  string *psVar3;
  vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_> *this;
  value_type *value;
  optional<const_tinyusdz::PrimSpec_*> local_118;
  undefined1 local_108 [8];
  optional<const_tinyusdz::PrimSpec_*> pv;
  PrimSpec *child;
  const_iterator __end2;
  const_iterator __begin2;
  vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_> *__range2;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 local_70 [8];
  string elementName;
  string abs_path;
  uint32_t depth_local;
  Path *path_local;
  string *parent_path_local;
  PrimSpec *parent_local;
  
  parent_path_local = (string *)parent;
  parent_local = (PrimSpec *)__return_storage_ptr__;
  if (depth < 0x8000001) {
    if (parent == (PrimSpec *)0x0) {
      nonstd::optional_lite::optional<const_tinyusdz::PrimSpec_*>::optional(__return_storage_ptr__);
    }
    else {
      std::__cxx11::string::string((string *)(elementName.field_2._M_local_buf + 8));
      psVar3 = PrimSpec::name_abi_cxx11_((PrimSpec *)parent_path_local);
      std::__cxx11::string::string((string *)local_70,(string *)psVar3);
      std::operator+(&local_b0,parent_path,"/");
      std::operator+(&local_90,&local_b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
      std::__cxx11::string::operator=
                ((string *)(elementName.field_2._M_local_buf + 8),(string *)&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      Path::full_path_name_abi_cxx11_(&local_d0,path);
      _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&elementName.field_2 + 8),&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      if (_Var1) {
        nonstd::optional_lite::optional<const_tinyusdz::PrimSpec_*>::
        optional<const_tinyusdz::PrimSpec_*,_0>
                  (__return_storage_ptr__,(PrimSpec **)&parent_path_local);
      }
      std::__cxx11::string::~string((string *)local_70);
      if (!_Var1) {
        this = PrimSpec::children((PrimSpec *)parent_path_local);
        __end2 = std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>::begin(this);
        child = (PrimSpec *)
                std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>::end(this);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end2,(__normal_iterator<const_tinyusdz::PrimSpec_*,_std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>_>
                                           *)&child), bVar2) {
          pv.contained = (storage_t<const_tinyusdz::PrimSpec_*>)
                         __gnu_cxx::
                         __normal_iterator<const_tinyusdz::PrimSpec_*,_std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>_>
                         ::operator*(&__end2);
          GetPrimSpecAtPathRec
                    (&local_118,(PrimSpec *)pv.contained,(string *)((long)&elementName.field_2 + 8),
                     path,depth + 1);
          nonstd::optional_lite::optional<const_tinyusdz::PrimSpec_*>::
          optional<const_tinyusdz::PrimSpec_*,_0>
                    ((optional<const_tinyusdz::PrimSpec_*> *)local_108,&local_118);
          nonstd::optional_lite::optional<const_tinyusdz::PrimSpec_*>::~optional(&local_118);
          bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_108);
          if (bVar2) {
            value = nonstd::optional_lite::optional<const_tinyusdz::PrimSpec_*>::value
                              ((optional<const_tinyusdz::PrimSpec_*> *)local_108);
            nonstd::optional_lite::optional<const_tinyusdz::PrimSpec_*>::
            optional<const_tinyusdz::PrimSpec_*&,_0>(__return_storage_ptr__,value);
          }
          nonstd::optional_lite::optional<const_tinyusdz::PrimSpec_*>::~optional
                    ((optional<const_tinyusdz::PrimSpec_*> *)local_108);
          if (bVar2) goto LAB_00174c2e;
          __gnu_cxx::
          __normal_iterator<const_tinyusdz::PrimSpec_*,_std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>_>
          ::operator++(&__end2);
        }
        nonstd::optional_lite::optional<const_tinyusdz::PrimSpec_*>::optional
                  (__return_storage_ptr__);
      }
LAB_00174c2e:
      std::__cxx11::string::~string((string *)(elementName.field_2._M_local_buf + 8));
    }
  }
  else {
    nonstd::optional_lite::optional<const_tinyusdz::PrimSpec_*>::optional(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<const PrimSpec *> GetPrimSpecAtPathRec(
    const PrimSpec *parent, const std::string &parent_path, const Path &path,
    uint32_t depth) {
  if (depth > (1024 * 1024 * 128)) {
    // Too deep.
    return nonstd::nullopt;
  }

  if (!parent) {
    return nonstd::nullopt;
  }

  std::string abs_path;
  {
    std::string elementName = parent->name();

    abs_path = parent_path + "/" + elementName;

    if (abs_path == path.full_path_name()) {
      return parent;
    }
  }

  for (const auto &child : parent->children()) {
    if (auto pv = GetPrimSpecAtPathRec(&child, abs_path, path, depth + 1)) {
      return pv.value();
    }
  }

  // not found
  return nonstd::nullopt;
}